

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDeadline.h
# Opt level: O2

void __thiscall EDeadline::EDeadline(EDeadline *this,string *arg,double expectedTimeForCompletion)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)arg);
  E::E(&this->super_E,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_E)._vptr_E = (_func_int **)&PTR__E_0011abf8;
  this->_m_expectedTimeForCompletion = expectedTimeForCompletion;
  return;
}

Assistant:

EDeadline(std::string arg, double expectedTimeForCompletion=0):
        E(arg),
        _m_expectedTimeForCompletion(expectedTimeForCompletion)
        {}